

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_msg.c
# Opt level: O0

nng_err http_req_parse_line(nng_http *conn,void *line)

{
  nng_http_status nVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *version;
  char *uri;
  char *method;
  void *line_local;
  nng_http *conn_local;
  
  nVar1 = nni_http_get_status(conn);
  if (nVar1 < NNG_HTTP_STATUS_BAD_REQUEST) {
    pcVar3 = strchr((char *)line,0x20);
    if (pcVar3 == (char *)0x0) {
      nni_http_set_status(conn,NNG_HTTP_STATUS_BAD_REQUEST,(char *)0x0);
      conn_local._4_4_ = NNG_OK;
    }
    else {
      *pcVar3 = '\0';
      pcVar3 = pcVar3 + 1;
      pcVar4 = strchr(pcVar3,0x20);
      if (pcVar4 == (char *)0x0) {
        nni_http_set_status(conn,NNG_HTTP_STATUS_BAD_REQUEST,(char *)0x0);
        conn_local._4_4_ = NNG_OK;
      }
      else {
        *pcVar4 = '\0';
        iVar2 = nni_url_canonify_uri(pcVar3);
        if (iVar2 == 0) {
          iVar2 = nni_http_set_version(conn,pcVar4 + 1);
          if (iVar2 == 0) {
            nni_http_set_method(conn,(char *)line);
            conn_local._4_4_ = nni_http_set_uri(conn,pcVar3,(char *)0x0);
          }
          else {
            nni_http_set_status(conn,NNG_HTTP_STATUS_HTTP_VERSION_NOT_SUPP,(char *)0x0);
            conn_local._4_4_ = NNG_OK;
          }
        }
        else {
          nni_http_set_status(conn,NNG_HTTP_STATUS_BAD_REQUEST,(char *)0x0);
          conn_local._4_4_ = NNG_OK;
        }
      }
    }
  }
  else {
    conn_local._4_4_ = NNG_OK;
  }
  return conn_local._4_4_;
}

Assistant:

static nng_err
http_req_parse_line(nng_http *conn, void *line)
{
	char *method;
	char *uri;
	char *version;

	if (nni_http_get_status(conn) >= NNG_HTTP_STATUS_BAD_REQUEST) {
		// we've already failed it, nothing else for us to do
		return (NNG_OK);
	}
	method = line;
	if ((uri = strchr(method, ' ')) == NULL) {
		nni_http_set_status(conn, NNG_HTTP_STATUS_BAD_REQUEST, NULL);
		return (NNG_OK);
	}
	*uri = '\0';
	uri++;

	if ((version = strchr(uri, ' ')) == NULL) {
		nni_http_set_status(conn, NNG_HTTP_STATUS_BAD_REQUEST, NULL);
		return (NNG_OK);
	}
	*version = '\0';
	version++;

	if (nni_url_canonify_uri(uri) != 0) {
		nni_http_set_status(conn, NNG_HTTP_STATUS_BAD_REQUEST, NULL);
		return (NNG_OK);
	}
	if (nni_http_set_version(conn, version)) {
		nni_http_set_status(
		    conn, NNG_HTTP_STATUS_HTTP_VERSION_NOT_SUPP, NULL);
		return (NNG_OK);
	}

	nni_http_set_method(conn, method);

	// this one only can fail due to ENOMEM
	return (nni_http_set_uri(conn, uri, NULL));
}